

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int> __thiscall
libtorrent::aux::merkle_tree::set_block(merkle_tree *this,int block_index,sha256_hash *h)

{
  bool bVar1;
  value_type *pvVar2;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *__args_2;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var3;
  int *piVar4;
  _Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false> _Var5;
  sha256_hash *in_RCX;
  undefined4 in_register_00000034;
  merkle_tree *this_00;
  int level_start;
  span<libtorrent::digest32<256L>_> tree;
  span<libtorrent::digest32<256L>_> tree_00;
  span<const_libtorrent::digest32<256L>_> tree_01;
  tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int> tVar6;
  int local_d4;
  int local_d0;
  int local_cc;
  int i;
  int local_c4;
  int leafs_end;
  undefined8 local_b8;
  libtorrent *local_b0;
  undefined8 local_a8;
  undefined1 local_9c [8];
  sha256_hash root;
  type *root_index;
  type *leafs_size;
  type *leafs_start;
  int local_58;
  digest32<256L> local_50;
  int local_30;
  int block_tree_index;
  int first_leaf;
  int num_leafs;
  sha256_hash *h_local;
  merkle_tree *pmStack_18;
  int block_index_local;
  merkle_tree *this_local;
  
  this_00 = (merkle_tree *)CONCAT44(in_register_00000034,block_index);
  h_local._4_4_ = (int)h;
  _first_leaf = in_RCX;
  pmStack_18 = this_00;
  this_local = this;
  block_tree_index = merkle_num_leafs(this_00->m_num_blocks);
  local_30 = merkle_first_leaf(block_tree_index);
  local_50.m_number._M_elems[7] = local_30 + h_local._4_4_;
  bVar1 = blocks_verified(this_00,h_local._4_4_,1);
  if (bVar1) {
    bVar1 = compare_node(this_00,local_50.m_number._M_elems[7],_first_leaf);
    if (bVar1) {
      local_50.m_number._M_elems[6] = 0;
      local_50.m_number._M_elems[5] = 1;
      tVar6 = ::std::make_tuple<libtorrent::aux::merkle_tree::set_block_result,int_const&,int>
                        ((set_block_result *)this,(int *)(local_50.m_number._M_elems + 6),
                         (int *)((long)&h_local + 4));
      _Var5 = tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>
              .super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>.
              _M_head_impl;
    }
    else {
      local_50.m_number._M_elems[4] = 3;
      local_50.m_number._M_elems[3] = 1;
      tVar6 = ::std::make_tuple<libtorrent::aux::merkle_tree::set_block_result,int_const&,int>
                        ((set_block_result *)this,(int *)(local_50.m_number._M_elems + 4),
                         (int *)((long)&h_local + 4));
      _Var5 = tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>
              .super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>.
              _M_head_impl;
    }
    goto LAB_003f9e07;
  }
  allocate_full(this_00);
  pvVar2 = container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
           ::operator[](&this_00->m_tree,local_50.m_number._M_elems[7]);
  *(undefined8 *)(pvVar2->m_number)._M_elems = *(undefined8 *)(_first_leaf->m_number)._M_elems;
  *(undefined8 *)((pvVar2->m_number)._M_elems + 2) =
       *(undefined8 *)((_first_leaf->m_number)._M_elems + 2);
  *(undefined8 *)((pvVar2->m_number)._M_elems + 4) =
       *(undefined8 *)((_first_leaf->m_number)._M_elems + 4);
  *(undefined8 *)((pvVar2->m_number)._M_elems + 6) =
       *(undefined8 *)((_first_leaf->m_number)._M_elems + 6);
  span<libtorrent::digest32<256l>const>::
  span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
            ((span<libtorrent::digest32<256l>const> *)&leafs_start,&this_00->m_tree);
  level_start = this_00->m_num_blocks;
  tree_01.m_len = (difference_type)leafs_start;
  tree_01.m_ptr = &local_50;
  merkle_find_known_subtree(tree_01,local_58,h_local._4_4_);
  __args_2 = ::std::get<0ul,int,int,int>((tuple<int,_int,_int> *)&local_50);
  p_Var3 = ::std::get<1ul,int,int,int>((tuple<int,_int,_int> *)&local_50);
  register0x00000000 = ::std::get<2ul,int,int,int>((tuple<int,_int,_int> *)&local_50);
  pvVar2 = container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
           ::operator[](&this_00->m_tree,*register0x00000000);
  bVar1 = digest32<256L>::is_all_zeros(pvVar2);
  if (bVar1) {
    root.m_number._M_elems[6] = 1;
    tVar6 = ::std::make_tuple<libtorrent::aux::merkle_tree::set_block_result,int_const&,int_const&>
                      ((set_block_result *)this,(int *)(root.m_number._M_elems + 6),__args_2);
    _Var5 = tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
            super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>.
            _M_head_impl;
    goto LAB_003f9e07;
  }
  pvVar2 = container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
           ::operator[](&this_00->m_tree,*stack0xffffffffffffff88);
  local_9c = *(undefined1 (*) [8])(pvVar2->m_number)._M_elems;
  root.m_number._M_elems._0_8_ = *(undefined8 *)((pvVar2->m_number)._M_elems + 2);
  root.m_number._M_elems._8_8_ = *(undefined8 *)((pvVar2->m_number)._M_elems + 4);
  root.m_number._M_elems._16_8_ = *(undefined8 *)((pvVar2->m_number)._M_elems + 6);
  span<libtorrent::digest32<256l>>::
  span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
            ((span<libtorrent::digest32<256l>> *)&local_b0,&this_00->m_tree);
  tree.m_len._0_4_ = *p_Var3;
  tree.m_ptr = (digest32<256L> *)local_a8;
  tree.m_len._4_4_ = 0;
  merkle_fill_tree(local_b0,tree,local_30 + *__args_2,level_start);
  pvVar2 = container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
           ::operator[](&this_00->m_tree,*stack0xffffffffffffff88);
  bVar1 = digest32<256L>::operator!=((digest32<256L> *)local_9c,pvVar2);
  if (bVar1) {
    span<libtorrent::digest32<256l>>::
    span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
              ((span<libtorrent::digest32<256l>> *)&leafs_end,&this_00->m_tree);
    tree_00.m_len._0_4_ = *p_Var3;
    tree_00.m_ptr = (digest32<256L> *)local_b8;
    tree_00.m_len._4_4_ = 0;
    merkle_clear_tree(_leafs_end,tree_00,local_30 + *__args_2,level_start);
    pvVar2 = container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
             ::operator[](&this_00->m_tree,*stack0xffffffffffffff88);
    *(undefined1 (*) [8])(pvVar2->m_number)._M_elems = local_9c;
    *(undefined8 *)((pvVar2->m_number)._M_elems + 2) = root.m_number._M_elems._0_8_;
    *(undefined8 *)((pvVar2->m_number)._M_elems + 4) = root.m_number._M_elems._8_8_;
    *(undefined8 *)((pvVar2->m_number)._M_elems + 6) = root.m_number._M_elems._16_8_;
    local_c4 = 2;
    tVar6 = ::std::make_tuple<libtorrent::aux::merkle_tree::set_block_result,int_const&,int_const&>
                      ((set_block_result *)this,&local_c4,__args_2);
    _Var5 = tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
            super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>.
            _M_head_impl;
    goto LAB_003f9e07;
  }
  local_cc = *__args_2 + *p_Var3;
  piVar4 = ::std::min<int>(&this_00->m_num_blocks,&local_cc);
  i = *piVar4;
  for (local_d0 = *__args_2; local_d0 < i; local_d0 = local_d0 + 1) {
    bitfield::set_bit(&this_00->m_block_verified,local_d0);
  }
  if (h_local._4_4_ == this_00->m_num_blocks + -1) {
LAB_003f9dd6:
    optimize_storage(this_00);
  }
  else {
    pvVar2 = container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
             ::operator[](&this_00->m_tree,local_50.m_number._M_elems[7] + 1);
    bVar1 = digest32<256L>::is_all_zeros(pvVar2);
    if (!bVar1) goto LAB_003f9dd6;
  }
  local_d4 = 0;
  tVar6 = ::std::make_tuple<libtorrent::aux::merkle_tree::set_block_result,int_const&,int_const&>
                    ((set_block_result *)this,&local_d4,__args_2);
  _Var5 = tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
          super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>._M_head_impl;
LAB_003f9e07:
  tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
  super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>._M_head_impl =
       _Var5._M_head_impl;
  tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
  super__Tuple_impl<1UL,_int,_int> = (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int>)
         tVar6.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>;
}

Assistant:

std::tuple<merkle_tree::set_block_result, int, int> merkle_tree::set_block(int const block_index
		, sha256_hash const& h)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif
		TORRENT_ASSERT(block_index < m_num_blocks);

		auto const num_leafs = merkle_num_leafs(m_num_blocks);
		auto const first_leaf = merkle_first_leaf(num_leafs);
		auto const block_tree_index = first_leaf + block_index;

		if (blocks_verified(block_index, 1))
		{
			// if this blocks's hash is already known, check the passed-in hash against it
			if (compare_node(block_tree_index, h))
				return std::make_tuple(set_block_result::ok, block_index, 1);
			else
				return std::make_tuple(set_block_result::block_hash_failed, block_index, 1);
		}

		allocate_full();

		m_tree[block_tree_index] = h;

		// to avoid wasting a lot of time hashing nodes only to discover they
		// cannot be verified, check first to see if the root of the largest
		// computable subtree is known

		auto const [leafs_start, leafs_size, root_index] =
			merkle_find_known_subtree(m_tree, block_index, m_num_blocks);

		// if the root node is unknown the hashes cannot be verified yet
		if (m_tree[root_index].is_all_zeros())
			return std::make_tuple(set_block_result::unknown, leafs_start, leafs_size);

		// save the root hash because merkle_fill_tree will overwrite it
		sha256_hash const root = m_tree[root_index];
		merkle_fill_tree(m_tree, leafs_size, first_leaf + leafs_start);

		if (root != m_tree[root_index])
		{
			// hash failure, clear all the internal nodes
			// the whole piece failed the hash check. Clear all block hashes
			// in this piece and report a hash failure
			merkle_clear_tree(m_tree, leafs_size, first_leaf + leafs_start);
			m_tree[root_index] = root;
			return std::make_tuple(set_block_result::hash_failed, leafs_start, leafs_size);
		}

		// TODO: this could be done more efficiently if bitfield had a function
		// to set a range of bits
		int const leafs_end = std::min(m_num_blocks, leafs_start + leafs_size);
		for (int i = leafs_start; i < leafs_end; ++i)
			m_block_verified.set_bit(i);

		// attempting to optimize storage is quite costly, only do it if we have
		// a reason to believe it might have an effect
		if (block_index == m_num_blocks - 1 || !m_tree[block_tree_index + 1].is_all_zeros())
			optimize_storage();

		return std::make_tuple(set_block_result::ok, leafs_start, leafs_size);
	}